

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_java_generator.cc
# Opt level: O2

string * __thiscall
t_java_generator::inner_enum_type_name_abi_cxx11_
          (string *__return_storage_ptr__,t_java_generator *this,t_type *ttype)

{
  int iVar1;
  t_type *ptVar2;
  string local_38;
  
  ptVar2 = t_type::get_true_type(ttype);
  iVar1 = (*(ptVar2->super_t_doc)._vptr_t_doc[0x10])(ptVar2);
  if ((char)iVar1 == '\0') {
    iVar1 = (*(ptVar2->super_t_doc)._vptr_t_doc[0xf])(ptVar2);
    if ((char)iVar1 == '\0') {
      std::__cxx11::string::string((string *)__return_storage_ptr__,"",(allocator *)&local_38);
      return __return_storage_ptr__;
    }
    ptVar2 = t_type::get_true_type(*(t_type **)&ptVar2[1].super_t_doc.has_doc_);
    type_name_abi_cxx11_(&local_38,this,ptVar2,true,false,false,false);
    std::operator+(__return_storage_ptr__,&local_38,".class");
  }
  else {
    ptVar2 = t_type::get_true_type(*(t_type **)&ptVar2[1].super_t_doc.has_doc_);
    type_name_abi_cxx11_(&local_38,this,ptVar2,true,false,false,false);
    std::operator+(__return_storage_ptr__,&local_38,".class");
  }
  std::__cxx11::string::~string((string *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

std::string inner_enum_type_name(t_type* ttype) {
    ttype = get_true_type(ttype);
    if (ttype->is_map()) {
      t_map* tmap = (t_map*)ttype;
      t_type* key_type = get_true_type(tmap->get_key_type());
      return type_name(key_type, true) + ".class";
    } else if (ttype->is_set()) {
      t_set* tset = (t_set*)ttype;
      t_type* elem_type = get_true_type(tset->get_elem_type());
      return type_name(elem_type, true) + ".class";
    }
    return "";
  }